

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O1

void __thiscall Chromosome::Chromosome(Chromosome *this)

{
  int iVar1;
  
  this->id = 0;
  this->collisions = 0;
  (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->changed = true;
  (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = idGlobal + 1;
  this->id = idGlobal;
  idGlobal = iVar1;
  return;
}

Assistant:

Chromosome::Chromosome() {
    id = idGlobal++;
}